

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_Constructors_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_Constructors_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  Message *message;
  AssertHelper *this_00;
  hasher hVar2;
  key_equal kVar3;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  AssertionResult gtest_ar_1;
  TypeParam ht_iter_fourarg;
  TypeParam ht_iter_threearg;
  TypeParam ht_iter_twoarg;
  TypeParam ht_iter_onearg;
  TypeParam ht_iter_noarg;
  value_type *end;
  value_type *begin;
  int num_inputs;
  value_type input [4];
  int old_alloc_count;
  AssertionResult gtest_ar;
  TypeParam ht_fourarg;
  TypeParam ht_threearg;
  TypeParam ht_twoarg;
  TypeParam ht_onearg;
  TypeParam ht_noarg;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  int alloc_count;
  hasher hasher;
  undefined8 in_stack_ffffffffffffef88;
  int iVar4;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffef90;
  unsigned_long *in_stack_ffffffffffffef98;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffefa0;
  key_equal *in_stack_ffffffffffffefa8;
  allocator_type *in_stack_ffffffffffffefb0;
  undefined4 in_stack_ffffffffffffefb8;
  Type in_stack_ffffffffffffefbc;
  hasher *in_stack_ffffffffffffefc0;
  int *in_stack_ffffffffffffefc8;
  undefined4 in_stack_ffffffffffffefd0;
  undefined4 in_stack_ffffffffffffefd4;
  allocator_type *in_stack_ffffffffffffefe0;
  Message *in_stack_fffffffffffff008;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff010;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_dc8;
  int local_db8;
  undefined4 local_db4;
  AssertionResult local_db0 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d90;
  int local_d80;
  undefined4 local_d7c;
  AssertionResult local_d78 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d58;
  int local_d48;
  undefined4 local_d44;
  AssertionResult local_d40 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d20;
  int local_d10;
  undefined4 local_d0c;
  AssertionResult local_d08 [2];
  key_equal local_ce8;
  key_equal local_cd8;
  int local_cc8;
  undefined4 local_cc4;
  AssertionResult local_cc0 [2];
  hasher local_ca0;
  hasher local_c90;
  int local_c80;
  undefined4 local_c7c;
  AssertionResult local_c78 [2];
  key_equal local_c58;
  key_equal local_c48;
  int local_c38;
  undefined4 local_c34;
  AssertionResult local_c30 [2];
  Message *local_c10;
  int local_c08;
  Message *local_c00;
  int local_bf8;
  int local_bf0;
  undefined4 local_bec;
  AssertionResult local_be8 [2];
  key_equal local_bc8;
  key_equal local_bb8;
  int local_ba8;
  undefined4 local_ba4;
  AssertionResult local_ba0 [2];
  hasher local_b80;
  hasher local_b70;
  int local_b60;
  undefined4 local_b5c;
  AssertionResult local_b58 [2];
  key_equal local_b38;
  key_equal local_b28;
  int local_b18;
  undefined4 local_b14;
  AssertionResult local_b10 [2];
  hasher local_af0;
  hasher local_ae0;
  int local_ad0;
  undefined4 local_acc;
  AssertionResult local_ac8 [2];
  key_equal local_aa8;
  key_equal local_a98;
  int local_a88;
  undefined4 local_a84;
  AssertionResult local_a80 [2];
  hasher local_a60;
  hasher local_a50;
  int local_a40;
  undefined4 local_a3c;
  AssertionResult local_a38 [2];
  key_equal local_a18;
  key_equal local_a08;
  int local_9f8;
  undefined4 local_9f4;
  AssertionResult local_9f0 [2];
  hasher local_9d0;
  hasher local_9c0;
  int local_9b0;
  undefined4 local_9ac;
  AssertionResult local_9a8 [2];
  key_equal local_988;
  key_equal local_978;
  int local_968;
  undefined4 local_964;
  AssertionResult local_960 [2];
  hasher local_940;
  hasher local_930;
  int local_920;
  undefined4 local_91c;
  AssertionResult local_918 [2];
  key_equal local_8f8;
  key_equal local_8e8;
  int local_8d8;
  undefined4 local_8d4;
  AssertionResult local_8d0 [2];
  hasher local_8b0;
  hasher local_8a0;
  int local_890;
  undefined4 local_88c;
  AssertionResult local_888 [2];
  undefined4 local_864;
  size_type local_860;
  AssertionResult local_858 [2];
  undefined4 local_834;
  size_type local_830;
  AssertionResult local_828 [2];
  undefined4 local_804;
  size_type local_800;
  AssertionResult local_7f8 [2];
  undefined4 local_7d4;
  size_type local_7d0;
  AssertionResult local_7c8 [2];
  undefined4 local_7a4;
  size_type local_7a0;
  AssertionResult local_798 [2];
  undefined4 local_774;
  size_type local_770;
  AssertionResult local_768 [2];
  AssertionResult local_748 [3];
  value_type local_710;
  int local_70c;
  AssertionResult local_6f8 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_660 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_5c8;
  Hasher local_5b4 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_520;
  Hasher local_510;
  Hasher local_504 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_470;
  Hasher local_460;
  Hasher local_454 [12];
  undefined1 *local_3c0;
  value_type *local_3b8;
  undefined4 local_3ac;
  value_type local_3a8;
  value_type local_3a4;
  value_type local_3a0;
  value_type local_39c;
  undefined1 auStack_398 [12];
  int local_38c;
  undefined4 local_374;
  AssertionResult local_370 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_2d8 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_240;
  Hasher local_22c [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_198;
  Hasher local_188;
  Hasher local_17c [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e8;
  Hasher local_d8 [2];
  Hasher local_bc [12];
  undefined1 local_28 [40];
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffef88 >> 0x20);
  Hasher::Hasher((Hasher *)(local_28 + 0x14),1);
  local_28._16_4_ = 0;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_28,2,
             (int *)(local_28 + 0x10));
  Hasher::Hasher(local_bc,0);
  Hasher::Hasher(local_d8,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_e8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             (size_type)in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,
             (key_equal *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_e8);
  Hasher::Hasher(local_17c,0);
  Hasher::Hasher(&local_188,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_198,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             (size_type)in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,
             (key_equal *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_198);
  Hasher::Hasher(local_22c,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_240,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             (size_type)in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,
             (key_equal *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_240);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_2d8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             (size_type)in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,
             (key_equal *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_2d8);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             (size_type)in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,
             (key_equal *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb0);
  local_374 = 1;
  testing::internal::CmpHelperLE<int,int>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb293f9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2945c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb294cd);
  local_38c = local_28._16_4_;
  local_3a8 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffef90,iVar4);
  local_3a4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffef90,iVar4);
  local_3a0 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffef90,iVar4);
  local_39c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffef90,iVar4);
  local_3ac = 4;
  local_3b8 = &local_3a8;
  local_3c0 = auStack_398;
  Hasher::Hasher(local_454,0);
  Hasher::Hasher(&local_460,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_470,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,int,kEmptyInt,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_DenseHashtable<int_const*>
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             in_stack_ffffffffffffefc8,&in_stack_ffffffffffffefc0->id_,
             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             (hasher *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,in_stack_ffffffffffffefe0
            );
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_470);
  Hasher::Hasher(local_504,0);
  Hasher::Hasher(&local_510,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_520,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,int,kEmptyInt,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_DenseHashtable<int_const*>
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             in_stack_ffffffffffffefc8,&in_stack_ffffffffffffefc0->id_,
             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             (hasher *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,in_stack_ffffffffffffefe0
            );
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_520);
  Hasher::Hasher(local_5b4,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_5c8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,int,kEmptyInt,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_DenseHashtable<int_const*>
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             in_stack_ffffffffffffefc8,&in_stack_ffffffffffffefc0->id_,
             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             (hasher *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,in_stack_ffffffffffffefe0
            );
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_5c8);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_660,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,int,kEmptyInt,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_DenseHashtable<int_const*>
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             in_stack_ffffffffffffefc8,&in_stack_ffffffffffffefc0->id_,
             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             (hasher *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,in_stack_ffffffffffffefe0
            );
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_660);
  this_01 = (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_28;
  google::
  HashtableInterface_DenseHashtable<int,int,kEmptyInt,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_DenseHashtable<int_const*>
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
             in_stack_ffffffffffffefc8,&in_stack_ffffffffffffefc0->id_,
             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             (hasher *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,in_stack_ffffffffffffefe0
            );
  testing::internal::CmpHelperGT<int,int>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb29a06);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb29a69);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb29ada);
  local_38c = local_28._16_4_;
  for (local_70c = 2; local_70c < 2000; local_70c = local_70c + 1) {
    local_710 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_ffffffffffffef90,(int)((ulong)this_01 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff010,(value_type *)in_stack_fffffffffffff008);
  }
  testing::internal::CmpHelperGT<int,int>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_748);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb29bd2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb29c35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb29ca6);
  local_770 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb29cb3);
  local_774 = 100;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             in_stack_ffffffffffffef98,(uint *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_768);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb29d4b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb29dae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb29e1f);
  local_7a0 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb29e2c);
  local_7a4 = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             in_stack_ffffffffffffef98,(uint *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_798);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb29ec4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb29f27);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb29f98);
  local_7d0 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb29fa5);
  local_7d4 = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             in_stack_ffffffffffffef98,(uint *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2a03d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2a0a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2a111);
  local_800 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb2a11e);
  local_804 = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             in_stack_ffffffffffffef98,(uint *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2a1b6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2a219);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2a28a);
  local_830 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb2a297);
  local_834 = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             in_stack_ffffffffffffef98,(uint *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_828);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2a32f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2a392);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2a403);
  local_860 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb2a410);
  local_864 = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             in_stack_ffffffffffffef98,(uint *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_858);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2a4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2a50b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2a57c);
  local_88c = 0;
  local_8b0 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffefa0);
  local_8a0 = local_8b0;
  local_890 = Hasher::id(&local_8a0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_888);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2a668);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2a6cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2a73c);
  local_8d4 = 0;
  local_8f8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffefa0);
  local_8e8 = local_8f8;
  local_8d8 = Hasher::id(&local_8e8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2a828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2a88b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2a8fc);
  local_91c = 0;
  local_940 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffefa0);
  local_930 = local_940;
  local_920 = Hasher::id(&local_930);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_918);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2a9e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2aa4b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2aabc);
  local_964 = 0;
  local_988 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffefa0);
  local_978 = local_988;
  local_968 = Hasher::id(&local_978);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_960);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2aba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2ac0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2ac7c);
  local_9ac = 1;
  local_9d0 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffefa0);
  local_9c0 = local_9d0;
  local_9b0 = Hasher::id(&local_9c0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2ad68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2adcb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2ae3c);
  local_9f4 = 0;
  local_a18 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffefa0);
  local_a08 = local_a18;
  local_9f8 = Hasher::id(&local_a08);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2af28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2af8b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2affc);
  local_a3c = 1;
  local_a60 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffefa0);
  local_a50 = local_a60;
  local_a40 = Hasher::id(&local_a50);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2b0e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2b14b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2b1bc);
  local_a84 = 1;
  local_aa8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffefa0);
  local_a98 = local_aa8;
  local_a88 = Hasher::id(&local_a98);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2b2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2b30b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2b37c);
  local_acc = 0;
  local_af0 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffefa0);
  local_ae0 = local_af0;
  local_ad0 = Hasher::id(&local_ae0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ac8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2b468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2b4cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2b53c);
  local_b14 = 0;
  local_b38 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffefa0);
  local_b28 = local_b38;
  local_b18 = Hasher::id(&local_b28);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b10);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2b628);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2b68b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2b6fc);
  local_b5c = 0;
  local_b80 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffefa0);
  local_b70 = local_b80;
  local_b60 = Hasher::id(&local_b70);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2b7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2b84b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2b8bc);
  local_ba4 = 0;
  local_bc8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffefa0);
  local_bb8 = local_bc8;
  local_ba8 = Hasher::id(&local_bb8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ba0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    in_stack_fffffffffffff010 =
         (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xb2b9a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2ba0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2ba7c);
  local_bec = 1;
  hVar2 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::hash_funct(in_stack_ffffffffffffefa0);
  local_c08 = hVar2.num_compares_;
  message = hVar2._0_8_;
  local_c10 = message;
  local_c00 = message;
  local_bf8 = local_c08;
  local_bf0 = Hasher::id((Hasher *)&local_c00);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_be8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2bb62);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_stack_fffffffffffff010,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2bbbf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2bc30);
  local_c34 = 0;
  local_c58 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffefa0);
  local_c48 = local_c58;
  local_c38 = Hasher::id(&local_c48);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2bd10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_stack_fffffffffffff010,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2bd6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2bdde);
  local_c7c = 1;
  local_ca0 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffefa0);
  local_c90 = local_ca0;
  local_c80 = Hasher::id(&local_c90);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb2bebe);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
               (char *)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_stack_fffffffffffff010,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2bf1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2bf8c);
  local_cc4 = 1;
  kVar3 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::key_eq(in_stack_ffffffffffffefa0);
  local_ce8 = kVar3;
  local_cd8 = kVar3;
  local_cc8 = Hasher::id(&local_cd8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_cc0);
  if (!bVar1) {
    testing::Message::Message(kVar3._0_8_);
    in_stack_ffffffffffffefb0 =
         (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0xb2c06c);
    testing::internal::AssertHelper::AssertHelper
              (kVar3._0_8_,kVar3.num_compares_,(char *)in_stack_ffffffffffffefb0,
               (int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),(char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_stack_fffffffffffff010,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2c0c9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2c13a);
  local_d0c = 0;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_01);
  local_d10 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_d20);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d08);
  if (!bVar1) {
    testing::Message::Message(kVar3._0_8_);
    in_stack_ffffffffffffefa8 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xb2c216);
    testing::internal::AssertHelper::AssertHelper
              (kVar3._0_8_,kVar3.num_compares_,(char *)in_stack_ffffffffffffefb0,
               (int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),(char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_stack_fffffffffffff010,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2c273);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2c2e4);
  local_d44 = 0;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_01);
  local_d48 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_d58);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d40);
  if (!bVar1) {
    testing::Message::Message(kVar3._0_8_);
    in_stack_ffffffffffffefa0 =
         (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xb2c3c0);
    testing::internal::AssertHelper::AssertHelper
              (kVar3._0_8_,kVar3.num_compares_,(char *)in_stack_ffffffffffffefb0,
               (int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),(char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_stack_fffffffffffff010,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2c41d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2c48e);
  local_d7c = 2;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_01);
  local_d80 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_d90);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d78);
  if (!bVar1) {
    testing::Message::Message(kVar3._0_8_);
    in_stack_ffffffffffffef98 =
         (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0xb2c56a);
    testing::internal::AssertHelper::AssertHelper
              (kVar3._0_8_,kVar3.num_compares_,(char *)in_stack_ffffffffffffefb0,
               (int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),(char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_stack_fffffffffffff010,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffef90);
    testing::Message::~Message((Message *)0xb2c5c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2c638);
  local_db4 = 2;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_01);
  local_db8 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_dc8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
             (int *)in_stack_ffffffffffffef98,(int *)in_stack_ffffffffffffef90);
  iVar4 = (int)((ulong)in_stack_ffffffffffffefa8 >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_dc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_db0);
  if (!bVar1) {
    testing::Message::Message(kVar3._0_8_);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb2c714)
    ;
    testing::internal::AssertHelper::AssertHelper
              (kVar3._0_8_,kVar3.num_compares_,(char *)in_stack_ffffffffffffefb0,iVar4,
               (char *)in_stack_ffffffffffffefa0);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_stack_fffffffffffff010,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xb2c771);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb2c7e2);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2c7ef);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2c7fc);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2c809);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2c816);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2c823);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2c830);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2c83d);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2c84a);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2c857);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb2c864);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_28);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, Constructors) {
  // The key/value types don't matter here, so I just test on one set
  // of tables, the ones with int keys, which can easily handle the
  // placement-news we have to do below.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  int alloc_count = 0;
  Alloc<typename TypeParam::key_type> alloc(2, &alloc_count);

  TypeParam ht_noarg;
  TypeParam ht_onearg(100);
  TypeParam ht_twoarg(100, hasher);
  TypeParam ht_threearg(100, hasher, hasher);  // hasher serves as key_equal too
  TypeParam ht_fourarg(100, hasher, hasher, alloc);

  // The allocator should have been called at most once, for the last ht.
  EXPECT_LE(1, alloc_count);
  int old_alloc_count = alloc_count;

  const typename TypeParam::value_type input[] = {
      this->UniqueObject(1), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};
  const int num_inputs = sizeof(input) / sizeof(input[0]);
  const typename TypeParam::value_type* begin = &input[0];
  const typename TypeParam::value_type* end = begin + num_inputs;
  TypeParam ht_iter_noarg(begin, end);
  TypeParam ht_iter_onearg(begin, end, 100);
  TypeParam ht_iter_twoarg(begin, end, 100, hasher);
  TypeParam ht_iter_threearg(begin, end, 100, hasher, hasher);
  TypeParam ht_iter_fourarg(begin, end, 100, hasher, hasher, alloc);
  // Now the allocator should have been called more.
  EXPECT_GT(alloc_count, old_alloc_count);
  old_alloc_count = alloc_count;

  // Let's do a lot more inserting and make sure the alloc-count goes up
  for (int i = 2; i < 2000; i++) ht_fourarg.insert(this->UniqueObject(i));
  EXPECT_GT(alloc_count, old_alloc_count);

  EXPECT_LT(ht_noarg.bucket_count(), 100u);
  EXPECT_GE(ht_onearg.bucket_count(), 100u);
  EXPECT_GE(ht_twoarg.bucket_count(), 100u);
  EXPECT_GE(ht_threearg.bucket_count(), 100u);
  EXPECT_GE(ht_fourarg.bucket_count(), 100u);
  EXPECT_GE(ht_iter_onearg.bucket_count(), 100u);

  // When we pass in a hasher -- it can serve both as the hash-function
  // and the key-equal function -- its id should be 1.  Where we don't
  // pass it in and use the default Hasher object, the id should be 0.
  EXPECT_EQ(0, ht_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_noarg.key_eq().id());
  EXPECT_EQ(0, ht_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_onearg.key_eq().id());
  EXPECT_EQ(1, ht_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_threearg.key_eq().id());

  EXPECT_EQ(0, ht_iter_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_noarg.key_eq().id());
  EXPECT_EQ(0, ht_iter_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_onearg.key_eq().id());
  EXPECT_EQ(1, ht_iter_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_iter_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_iter_threearg.key_eq().id());

  // Likewise for the allocator
  EXPECT_EQ(0, ht_threearg.get_allocator().id());
  EXPECT_EQ(0, ht_iter_threearg.get_allocator().id());
  EXPECT_EQ(2, ht_fourarg.get_allocator().id());
  EXPECT_EQ(2, ht_iter_fourarg.get_allocator().id());
}